

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.h
# Opt level: O0

void __thiscall
Scs::Allocator<Scs::Address>::construct<Scs::Socket,std::shared_ptr<Scs::Address>&>
          (Allocator<Scs::Address> *this,Socket *ptr,shared_ptr<Scs::Address> *args)

{
  shared_ptr<Scs::Address> local_30;
  shared_ptr<Scs::Address> *local_20;
  shared_ptr<Scs::Address> *args_local;
  Socket *ptr_local;
  Allocator<Scs::Address> *this_local;
  
  local_20 = args;
  args_local = (shared_ptr<Scs::Address> *)ptr;
  ptr_local = (Socket *)this;
  std::shared_ptr<Scs::Address>::shared_ptr(&local_30,args);
  Socket::Socket(ptr,&local_30);
  std::shared_ptr<Scs::Address>::~shared_ptr(&local_30);
  return;
}

Assistant:

void construct(U* ptr, Args&&  ... args) { ::new ((void*)(ptr)) U(std::forward<Args>(args)...); }